

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QCache<QString,_QRegularExpression>::Node>::moveFromSpan
          (Span<QCache<QString,_QRegularExpression>::Node> *this,
          Span<QCache<QString,_QRegularExpression>::Node> *fromSpan,size_t fromIndex,size_t to)

{
  Entry *pEVar1;
  Entry *pEVar2;
  byte bVar3;
  byte bVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  int *piVar7;
  uchar uVar8;
  Value *this_00;
  
  uVar8 = this->nextFree;
  if (uVar8 == this->allocated) {
    addStorage(this);
    uVar8 = this->nextFree;
  }
  this->offsets[to] = uVar8;
  pEVar5 = this->entries;
  bVar3 = this->nextFree;
  this->nextFree = pEVar5[bVar3].storage.data[0];
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar1 = fromSpan->entries + bVar4;
  pEVar2 = fromSpan->entries + bVar4;
  this_00 = (Value *)((pEVar2->storage).data + 0x28);
  uVar6 = *(undefined8 *)((pEVar2->storage).data + 8);
  *(undefined8 *)pEVar5[bVar3].storage.data = *(undefined8 *)(pEVar2->storage).data;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 8) = uVar6;
  uVar6 = *(undefined8 *)((pEVar2->storage).data + 0x10);
  (pEVar2->storage).data[0x10] = '\0';
  (pEVar2->storage).data[0x11] = '\0';
  (pEVar2->storage).data[0x12] = '\0';
  (pEVar2->storage).data[0x13] = '\0';
  (pEVar2->storage).data[0x14] = '\0';
  (pEVar2->storage).data[0x15] = '\0';
  (pEVar2->storage).data[0x16] = '\0';
  (pEVar2->storage).data[0x17] = '\0';
  *(undefined8 *)(pEVar5[bVar3].storage.data + 0x10) = uVar6;
  uVar6 = *(undefined8 *)((pEVar2->storage).data + 0x18);
  (pEVar2->storage).data[0x18] = '\0';
  (pEVar2->storage).data[0x19] = '\0';
  (pEVar2->storage).data[0x1a] = '\0';
  (pEVar2->storage).data[0x1b] = '\0';
  (pEVar2->storage).data[0x1c] = '\0';
  (pEVar2->storage).data[0x1d] = '\0';
  (pEVar2->storage).data[0x1e] = '\0';
  (pEVar2->storage).data[0x1f] = '\0';
  *(undefined8 *)(pEVar5[bVar3].storage.data + 0x18) = uVar6;
  uVar6 = *(undefined8 *)((pEVar2->storage).data + 0x20);
  (pEVar2->storage).data[0x20] = '\0';
  (pEVar2->storage).data[0x21] = '\0';
  (pEVar2->storage).data[0x22] = '\0';
  (pEVar2->storage).data[0x23] = '\0';
  (pEVar2->storage).data[0x24] = '\0';
  (pEVar2->storage).data[0x25] = '\0';
  (pEVar2->storage).data[0x26] = '\0';
  (pEVar2->storage).data[0x27] = '\0';
  *(undefined8 *)(pEVar5[bVar3].storage.data + 0x20) = uVar6;
  *(QRegularExpression **)(pEVar5[bVar3].storage.data + 0x28) = this_00->t;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 0x30) =
       *(undefined8 *)((pEVar2->storage).data + 0x30);
  this_00->t = (QRegularExpression *)0x0;
  *(Entry **)(*(long *)pEVar5[bVar3].storage.data + 8) = pEVar5 + bVar3;
  **(long **)(pEVar5[bVar3].storage.data + 8) = (long)(pEVar5 + bVar3);
  QCache<QString,_QRegularExpression>::Value::~Value(this_00);
  piVar7 = *(int **)((pEVar2->storage).data + 0x10);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      QArrayData::deallocate(*(QArrayData **)((pEVar1->storage).data + 0x10),2,0x10);
    }
  }
  (pEVar1->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }